

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  RTCScene in_stack_00000010;
  RTCScene in_stack_00000020;
  
  embree::g_scene = rtcNewScene(g_device);
  rtcSetSceneFlags(embree::g_scene,4);
  embree::addGroundPlane(in_stack_00000010);
  embree::addCube(in_stack_00000020);
  rtcCommitScene(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  g_scene = rtcNewScene(g_device);
  rtcSetSceneFlags(g_scene,RTC_SCENE_FLAG_ROBUST);

  /* add ground plane */
  addGroundPlane(g_scene);

  /* add cube */
  addCube(g_scene);

  /* commit changes to scene */
  rtcCommitScene (g_scene);
}